

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O3

int get_comp_index_context(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  byte bVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  RefCntBuffer *pRVar8;
  uint uVar9;
  uint uVar10;
  int m;
  uint uVar11;
  RefCntBuffer *pRVar12;
  
  bVar1 = (*xd->mi)->ref_frame[0];
  if (((byte)(bVar1 - 1) < 8) && ((long)cm->remapped_ref_idx[bVar1 - 1] != -1)) {
    pRVar8 = cm->ref_frame_map[cm->remapped_ref_idx[bVar1 - 1]];
  }
  else {
    pRVar8 = (RefCntBuffer *)0x0;
  }
  bVar1 = (*xd->mi)->ref_frame[1];
  uVar5 = 0;
  if (((byte)(bVar1 - 1) < 8) && ((long)cm->remapped_ref_idx[bVar1 - 1] != -1)) {
    pRVar12 = cm->ref_frame_map[cm->remapped_ref_idx[bVar1 - 1]];
  }
  else {
    pRVar12 = (RefCntBuffer *)0x0;
  }
  if (pRVar8 != (RefCntBuffer *)0x0) {
    uVar5 = pRVar8->order_hint;
  }
  iVar6 = 0;
  uVar10 = 0;
  if (pRVar12 != (RefCntBuffer *)0x0) {
    uVar10 = pRVar12->order_hint;
  }
  iVar7 = 0;
  if ((cm->seq_params->order_hint_info).enable_order_hint != 0) {
    uVar9 = cm->cur_frame->order_hint;
    uVar10 = uVar10 - uVar9;
    uVar11 = 1 << ((byte)(cm->seq_params->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    iVar6 = (uVar11 - 1 & uVar10) - (uVar10 & uVar11);
    uVar9 = uVar9 - uVar5;
    iVar7 = (uVar11 - 1 & uVar9) - (uVar9 & uVar11);
  }
  pMVar2 = xd->left_mbmi;
  pMVar3 = xd->above_mbmi;
  uVar10 = 0;
  uVar5 = 0;
  if (pMVar3 != (MB_MODE_INFO *)0x0) {
    if (pMVar3->ref_frame[1] < '\x01') {
      uVar5 = (uint)(pMVar3->ref_frame[0] == '\a');
    }
    else {
      uVar5 = *(ushort *)&pMVar3->field_0xa7 >> 9 & 1;
    }
  }
  if (pMVar2 != (MB_MODE_INFO *)0x0) {
    if (pMVar2->ref_frame[1] < '\x01') {
      uVar10 = (uint)(pMVar2->ref_frame[0] == '\a');
    }
    else {
      uVar10 = *(ushort *)&pMVar2->field_0xa7 >> 9 & 1;
    }
  }
  iVar4 = -iVar6;
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  iVar6 = -iVar7;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  return uVar5 + uVar10 + (uint)(iVar4 == iVar6) * 3;
}

Assistant:

static inline int get_comp_index_context(const AV1_COMMON *cm,
                                         const MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  int bck_frame_index = 0, fwd_frame_index = 0;
  int cur_frame_index = cm->cur_frame->order_hint;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int fwd = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  fwd_frame_index, cur_frame_index));
  int bck = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  cur_frame_index, bck_frame_index));

  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;

  int above_ctx = 0, left_ctx = 0;
  const int offset = (fwd == bck);

  if (above_mi != NULL) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->compound_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 1;
  }

  if (left_mi != NULL) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->compound_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 1;
  }

  return above_ctx + left_ctx + 3 * offset;
}